

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  uint uVar3;
  undefined1 in_CL;
  uint uVar4;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  float fVar5;
  ImVec2 IVar6;
  ImGuiWindow *child_window;
  bool ret;
  float backup_border_size;
  int auto_fit_axises;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003b4;
  bool *in_stack_000003b8;
  char *in_stack_000003c0;
  ImVec2 *in_stack_ffffffffffffffa8;
  float local_40;
  float local_38;
  float fStack_34;
  ImGuiWindow *window;
  ImGuiContext *pIVar7;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar8;
  
  uVar8 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  window = GImGui->CurrentWindow;
  uVar3 = in_R8D | 0x1000103 | window->Flags & 4U;
  pIVar7 = GImGui;
  IVar6 = GetContentRegionAvail();
  _local_40 = ImFloor(in_stack_ffffffffffffffa8);
  uVar4 = 0;
  if (stack0xffffffffffffffc4 == 0.0) {
    uVar4 = 2;
  }
  uVar4 = local_40 == 0.0 | uVar4;
  if (local_40 <= 0.0) {
    local_38 = IVar6.x;
    fVar5 = ImMax<float>(local_38 + local_40,4.0);
    local_40 = fVar5;
  }
  if (stack0xffffffffffffffc4 <= 0.0) {
    fStack_34 = IVar6.y;
    fVar5 = ImMax<float>(fStack_34 + stack0xffffffffffffffc4,4.0);
    stack0xffffffffffffffc4 = fVar5;
  }
  SetNextWindowSize((ImVec2 *)&local_40,0);
  if (in_RDI == 0) {
    ImFormatString(pIVar7->TempBuffer,0xc01,"%s/%08X",window->Name,(ulong)in_ESI);
  }
  else {
    ImFormatString(pIVar7->TempBuffer,0xc01,"%s/%s_%08X",window->Name,in_RDI,(ulong)in_ESI);
  }
  fVar5 = (pIVar7->Style).ChildBorderSize;
  if ((uVar8 & 0x1000000) == 0) {
    (pIVar7->Style).ChildBorderSize = 0.0;
  }
  bVar2 = Begin(in_stack_000003c0,in_stack_000003b8,in_stack_000003b4);
  (pIVar7->Style).ChildBorderSize = fVar5;
  pIVar1 = pIVar7->CurrentWindow;
  pIVar1->ChildId = in_ESI;
  pIVar1->AutoFitChildAxises = (ImS8)uVar4;
  if (pIVar1->BeginCount == 1) {
    (window->DC).CursorPos = pIVar1->Pos;
  }
  if (((pIVar7->NavActivateId == in_ESI) && ((uVar3 & 0x800000) == 0)) &&
     (((pIVar1->DC).NavLayersActiveMask != 0 || (((pIVar1->DC).NavHasScroll & 1U) != 0)))) {
    FocusWindow(window);
    NavInitWindow((ImGuiWindow *)CONCAT44(uVar8,uVar3),SUB81((ulong)pIVar7 >> 0x38,0));
    SetActiveID((ImGuiID)stack0xffffffffffffffc4,(ImGuiWindow *)CONCAT44(uVar4,fVar5));
    pIVar7->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    if (name)
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(g.TempBuffer, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayersActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id + 1, child_window); // Steal ActiveId with another arbitrary id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}